

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransporthttp.c
# Opt level: O3

int concat_Properties(STRING_HANDLE existing,MAP_HANDLE map,
                     size_t *propertiesMessageSizeContribution)

{
  char **ppcVar1;
  char **ppcVar2;
  MAP_RESULT MVar3;
  int iVar4;
  LOGGER_LOG p_Var5;
  size_t sVar6;
  size_t sVar7;
  int iVar8;
  char *pcVar9;
  size_t sVar10;
  size_t sVar11;
  size_t count;
  char **values;
  char **keys;
  size_t local_58;
  char **local_50;
  char **local_48;
  char **local_40;
  char **local_38;
  
  MVar3 = Map_GetInternals(map,&local_48,&local_50,&local_58);
  if (MVar3 != MAP_OK) {
    p_Var5 = xlogging_get_log_function();
    iVar4 = 0x488;
    if (p_Var5 == (LOGGER_LOG)0x0) {
      return 0x488;
    }
    pcVar9 = "error while Map_GetInternals";
    iVar8 = 0x489;
    goto LAB_0012cd55;
  }
  if (local_58 == 0) {
    *propertiesMessageSizeContribution = 0;
    return 0;
  }
  iVar4 = STRING_concat(existing,",\"properties\":");
  ppcVar2 = local_48;
  ppcVar1 = local_50;
  sVar10 = local_58;
  if (iVar4 != 0) {
    p_Var5 = xlogging_get_log_function();
    iVar4 = 0x499;
    if (p_Var5 == (LOGGER_LOG)0x0) {
      return 0x499;
    }
    pcVar9 = "failed STRING_concat";
    iVar8 = 0x49a;
    goto LAB_0012cd55;
  }
  iVar4 = STRING_concat(existing,"{");
  if (iVar4 == 0) {
    if (sVar10 != 0) {
      sVar11 = 0;
      do {
        pcVar9 = ",\"iothub-app-";
        if (sVar11 == 0) {
          pcVar9 = "\"iothub-app-";
        }
        iVar4 = STRING_concat(existing,pcVar9);
        if ((((iVar4 != 0) || (iVar4 = STRING_concat(existing,ppcVar2[sVar11]), iVar4 != 0)) ||
            (iVar4 = STRING_concat(existing,"\":\""), iVar4 != 0)) ||
           ((iVar4 = STRING_concat(existing,ppcVar1[sVar11]), iVar4 != 0 ||
            (iVar4 = STRING_concat(existing,"\""), iVar4 != 0)))) {
          p_Var5 = xlogging_get_log_function();
          if (p_Var5 == (LOGGER_LOG)0x0) goto LAB_0012cec8;
          pcVar9 = "unable to STRING_concat";
          iVar4 = 0x4c8;
          goto LAB_0012cebd;
        }
        sVar11 = sVar11 + 1;
      } while (sVar10 != sVar11);
    }
    iVar4 = STRING_concat(existing,"}");
    if (iVar4 == 0) {
      *propertiesMessageSizeContribution = 0;
      if (local_58 == 0) {
        return 0;
      }
      local_38 = local_48;
      local_40 = local_50;
      sVar10 = 0;
      sVar11 = 0;
      do {
        sVar6 = strlen(local_38[sVar11]);
        sVar7 = strlen(local_40[sVar11]);
        sVar10 = sVar10 + sVar7 + sVar6 + 0x10;
        *propertiesMessageSizeContribution = sVar10;
        sVar11 = sVar11 + 1;
      } while (local_58 != sVar11);
      return 0;
    }
    p_Var5 = xlogging_get_log_function();
    if (p_Var5 != (LOGGER_LOG)0x0) {
      pcVar9 = "unable to STRING_concat";
      iVar4 = 0x4d4;
      goto LAB_0012cebd;
    }
  }
  else {
    p_Var5 = xlogging_get_log_function();
    if (p_Var5 != (LOGGER_LOG)0x0) {
      pcVar9 = "STRING_construct failed";
      iVar4 = 0x4b8;
LAB_0012cebd:
      (*p_Var5)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransporthttp.c"
                ,"appendMapToJSON",iVar4,1,pcVar9);
    }
  }
LAB_0012cec8:
  p_Var5 = xlogging_get_log_function();
  iVar4 = 0x49e;
  if (p_Var5 == (LOGGER_LOG)0x0) {
    return 0x49e;
  }
  pcVar9 = "unable to append the properties";
  iVar8 = 0x49f;
LAB_0012cd55:
  (*p_Var5)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransporthttp.c"
            ,"concat_Properties",iVar8,1,pcVar9);
  return iVar4;
}

Assistant:

static int concat_Properties(STRING_HANDLE existing, MAP_HANDLE map, size_t* propertiesMessageSizeContribution)
{
    int result;
    const char*const* keys;
    const char*const* values;
    size_t count;
    if (Map_GetInternals(map, &keys, &values, &count) != MAP_OK)
    {
        result = MU_FAILURE;
        LogError("error while Map_GetInternals");
    }
    else
    {

        if (count == 0)
        {
            /*no properties - do nothing with existing*/
            result = 0;
            *propertiesMessageSizeContribution = 0;
        }
        else
        {
            if (STRING_concat(existing, ",\"properties\":") != 0)
            {
                /*go ahead and return it*/
                result = MU_FAILURE;
                LogError("failed STRING_concat");
            }
            else if (appendMapToJSON(existing, keys, values, count) != 0)
            {
                result = MU_FAILURE;
                LogError("unable to append the properties");
            }
            else
            {
                /*all is fine*/
                size_t i;
                *propertiesMessageSizeContribution = 0;
                for (i = 0; i < count; i++)
                {
                    *propertiesMessageSizeContribution += (strlen(keys[i]) + strlen(values[i]) + MAXIMUM_PROPERTY_OVERHEAD);
                }
                result = 0;
            }
        }
    }
    return result;
}